

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.h
# Opt level: O0

void __thiscall
simdjson::fallback::ondemand::value_iterator::assert_at_container_start(value_iterator *this)

{
  value_iterator *this_local;
  
  if ((this->_json_iter->token)._position != this->_start_position + 1) {
    __assert_fail("_json_iter->token._position == _start_position + 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                  ,0x6761,
                  "void simdjson::fallback::ondemand::value_iterator::assert_at_container_start() const"
                 );
  }
  if (this->_json_iter->_depth == this->_depth) {
    if (0 < this->_depth) {
      return;
    }
    __assert_fail("_depth > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                  ,0x6763,
                  "void simdjson::fallback::ondemand::value_iterator::assert_at_container_start() const"
                 );
  }
  __assert_fail("_json_iter->_depth == _depth",
                "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                ,0x6762,
                "void simdjson::fallback::ondemand::value_iterator::assert_at_container_start() const"
               );
}

Assistant:

inline void value_iterator::assert_at_container_start() const noexcept {
  SIMDJSON_ASSUME( _json_iter->token._position == _start_position + 1 );
  SIMDJSON_ASSUME( _json_iter->_depth == _depth );
  SIMDJSON_ASSUME( _depth > 0 );
}